

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::SLUFactor<double>::solve2right4update
          (SLUFactor<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y,
          SVectorBase<double> *b,SSVectorBase<double> *rhs)

{
  CLUFactor<double> *this_00;
  element_type *this_01;
  int *piVar1;
  double *pdVar2;
  int *piVar3;
  double *pdVar4;
  double *pdVar5;
  SSVectorBase<double> *this_02;
  double *pdVar6;
  SSVectorBase<double> *in_RDX;
  SSVectorBase<double> *in_RSI;
  long in_RDI;
  SSVectorBase<double> *in_R8;
  double *rhs_00;
  double epsilon;
  int *ridx;
  int rsize;
  int *sidx;
  int f;
  int n;
  CLUFactor<double> *in_stack_fffffffffffffe88;
  int n_00;
  SSVectorBase<double> *in_stack_fffffffffffffe90;
  SSVectorBase<double> *rhs_01;
  SSVectorBase<double> *this_03;
  int *in_stack_fffffffffffffec8;
  double *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  double *in_stack_fffffffffffffee0;
  double in_stack_fffffffffffffee8;
  CLUFactor<double> *in_stack_fffffffffffffef0;
  double *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  double *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff20;
  double *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  undefined1 local_60 [4];
  int local_5c;
  SSVectorBase<double> *local_58;
  SSVectorBase<double> *local_48;
  SSVectorBase<double> *local_40;
  
  local_58 = in_R8;
  local_48 = in_RDX;
  local_40 = in_RSI;
  (**(code **)(**(long **)(in_RDI + 0x388) + 0x18))();
  this_00 = (CLUFactor<double> *)SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe90);
  SSVectorBase<double>::setSize
            (in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  SSVectorBase<double>::forceSetup((SSVectorBase<double> *)(in_RDI + 0x278));
  SSVectorBase<double>::size((SSVectorBase<double> *)0x250d36);
  SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe90);
  CLUFactor<double>::tolerances(in_stack_fffffffffffffe88);
  this_01 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x250d80);
  rhs_00 = (double *)Tolerances::epsilon(this_01);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x250da0);
  SSVectorBase<double>::clear(in_stack_fffffffffffffe90);
  SSVectorBase<double>::clear(in_stack_fffffffffffffe90);
  *(undefined1 *)(in_RDI + 0x2c8) = 1;
  SSVectorBase<double>::operator=
            (in_stack_fffffffffffffe90,(SVectorBase<double> *)in_stack_fffffffffffffe88);
  if (*(int *)(in_RDI + 0xb0) == 0) {
    local_5c = SSVectorBase<double>::size((SSVectorBase<double> *)0x250e18);
    piVar1 = (int *)(in_RDI + 0x10);
    pdVar6 = rhs_00;
    pdVar2 = SSVectorBase<double>::altValues(in_stack_fffffffffffffe90);
    piVar3 = SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe90);
    pdVar4 = SSVectorBase<double>::get_ptr((SSVectorBase<double> *)0x250e85);
    pdVar5 = SSVectorBase<double>::altValues(in_stack_fffffffffffffe90);
    n_00 = (int)((ulong)pdVar5 >> 0x20);
    this_02 = (SSVectorBase<double> *)SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe90);
    SSVectorBase<double>::altValues(in_stack_fffffffffffffe90);
    rhs_01 = (SSVectorBase<double> *)0x0;
    this_03 = (SSVectorBase<double> *)0x0;
    CLUFactor<double>::vSolveRight4update2sparse
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (int *)0x0,0.0,in_stack_ffffffffffffff00,piVar1,pdVar6,(int *)pdVar2,piVar3,pdVar4,
               (int *)this_00,(int *)rhs_00);
    SSVectorBase<double>::setSize(this_02,n_00);
    SSVectorBase<double>::unSetup(local_40);
    SSVectorBase<double>::setSize(this_02,n_00);
    SSVectorBase<double>::unSetup(local_48);
    SSVectorBase<double>::setup_and_assign<double>(this_03,rhs_01);
  }
  else {
    SSVectorBase<double>::clear(in_stack_fffffffffffffe90);
    local_5c = SSVectorBase<double>::size((SSVectorBase<double> *)0x25101c);
    piVar1 = (int *)(in_RDI + 0x10);
    pdVar6 = SSVectorBase<double>::altValues(in_stack_fffffffffffffe90);
    pdVar2 = (double *)SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe90);
    pdVar4 = SSVectorBase<double>::get_ptr((SSVectorBase<double> *)0x25107d);
    pdVar5 = SSVectorBase<double>::altValues(in_stack_fffffffffffffe90);
    n_00 = (int)((ulong)pdVar5 >> 0x20);
    this_02 = (SSVectorBase<double> *)SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe90);
    SSVectorBase<double>::altValues(in_stack_fffffffffffffe90);
    pdVar5 = SSVectorBase<double>::altValues(in_stack_fffffffffffffe90);
    piVar3 = SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffe90);
    CLUFactor<double>::vSolveRight4update2sparse
              (this_00,(double)pdVar4,pdVar2,(int *)pdVar6,rhs_00,piVar1,piVar3,(double)local_60,
               pdVar5,in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff38);
    SSVectorBase<double>::setSize(this_02,n_00);
    SSVectorBase<double>::forceSetup(local_40);
    SSVectorBase<double>::setSize(this_02,n_00);
    SSVectorBase<double>::forceSetup(local_48);
    SSVectorBase<double>::setSize(this_02,n_00);
    SSVectorBase<double>::forceSetup((SSVectorBase<double> *)(in_RDI + 800));
  }
  SSVectorBase<double>::forceSetup(local_58);
  SSVectorBase<double>::setSize(this_02,n_00);
  SSVectorBase<double>::forceSetup((SSVectorBase<double> *)(in_RDI + 0x278));
  *(int *)(in_RDI + 0x394) = *(int *)(in_RDI + 0x394) + 2;
  (**(code **)(**(long **)(in_RDI + 0x388) + 0x20))();
  return;
}

Assistant:

void SLUFactor<R>::solve2right4update(
   SSVectorBase<R>&       x,
   SSVectorBase<R>&       y,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs)
{

   solveTime->start();

   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      this->vSolveRight4update2sparse(epsilon, x.altValues(), x.altIndexMem(),
                                      ssvec.get_ptr(), sidx, n,
                                      epsilon, y.altValues(), y.altIndexMem(),
                                      rhs.altValues(), ridx, rsize,
                                      nullptr, nullptr, nullptr);
      x.setSize(n);
      //      x.forceSetup();
      x.unSetup();
      y.setSize(rsize);
      y.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      this->vSolveRight4update2sparse(epsilon, x.altValues(), x.altIndexMem(),
                                      ssvec.get_ptr(), sidx, n,
                                      epsilon, y.altValues(), y.altIndexMem(),
                                      rhs.altValues(), ridx, rsize,
                                      forest.altValues(), &f, forest.altIndexMem());
      x.setSize(n);
      x.forceSetup();
      y.setSize(rsize);
      y.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}